

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample01.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  object *poVar4;
  handle *handle;
  ostream *poVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  char *pcVar7;
  int extraout_EDX;
  object *object;
  object *object_00;
  long unaff_R13;
  undefined1 auVar8 [16];
  dict local;
  dict global;
  object result;
  item_accessor func_01;
  item_accessor func_02;
  item_accessor func_03;
  handle local_228;
  handle local_220;
  undefined1 local_218 [16];
  undefined1 auStack_208 [16];
  handle local_1f8;
  long local_1f0;
  object local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  PyObject *local_1d8;
  PyObject *local_1d0;
  object local_1c8;
  object local_1c0;
  object local_1b8;
  object local_1b0;
  handle local_1a8;
  object local_1a0;
  object local_198;
  object local_190;
  object local_188;
  object local_180;
  object local_178;
  object local_170;
  object local_168;
  object local_160;
  object local_158;
  object local_150;
  object local_148;
  object local_140;
  object local_138;
  object local_130;
  object local_128;
  object local_120;
  object local_118;
  object local_110;
  object local_108;
  object local_100;
  object local_f8;
  item_accessor local_f0;
  item_accessor local_d0;
  object local_b0;
  item_accessor local_a8;
  object local_88;
  object local_80;
  object local_78;
  object local_70;
  object local_68;
  object local_60;
  object local_58;
  object local_50;
  object local_48;
  object local_40;
  object local_38;
  
  lVar3 = Py_DecodeLocale(*argv,0);
  if (lVar3 == 0) {
    main_cold_1();
    pybind11::object::~object(&local_1c8);
    pybind11::object::~object(&local_1c0);
    pybind11::object::~object(&local_1b8);
    pybind11::object::~object(&local_a8.cache);
    pybind11::object::~object(&local_a8.key);
    pybind11::object::~object((object *)((long)&local_d0 + 0x18));
    pybind11::object::~object((object *)((long)&local_d0 + 0x10));
    pybind11::object::~object((object *)((long)&local_f0 + 0x18));
    pybind11::object::~object((object *)((long)&local_f0 + 0x10));
    pybind11::object::~object((object *)&local_228);
    pybind11::object::~object((object *)&local_1f8);
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar6 = (long *)__cxa_begin_catch(extraout_RAX);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Python error.\n",0xe);
    pcVar7 = (char *)(**(code **)(*plVar6 + 0x10))(plVar6);
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    __cxa_end_catch();
  }
  else {
    Py_SetProgramName(lVar3);
    Py_Initialize();
    pybind11::module::import((module *)&local_d0,"__main__");
    local_218._8_8_ = local_d0._0_8_;
    auStack_208._0_8_ = "__dict__";
    auStack_208._8_8_ = (PyObject *)0x0;
    poVar4 = pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                       ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_218);
    local_f0._0_8_ = (poVar4->super_handle).m_ptr;
    if ((PyObject *)local_f0._0_8_ != (PyObject *)0x0) {
      ((PyObject *)local_f0._0_8_)->ob_refcnt = ((PyObject *)local_f0._0_8_)->ob_refcnt + 1;
    }
    pybind11::dict::dict((dict *)&local_1f8,(object *)&local_f0);
    pybind11::object::~object((object *)&local_f0);
    pybind11::object::~object((object *)(auStack_208 + 8));
    pybind11::object::~object((object *)&local_d0);
    pybind11::dict::dict((dict *)&local_228);
    pybind11::str::str((str *)&local_f8,"from time import time,ctime");
    local_100.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_108.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)1>
              ((pybind11 *)&local_38,(str *)&local_f8,&local_100,&local_108);
    pybind11::object::~object(&local_38);
    pybind11::object::~object(&local_108);
    pybind11::object::~object(&local_100);
    pybind11::object::~object(&local_f8);
    pybind11::str::str((str *)&local_110,"print(\'Today is\', ctime(time()))");
    local_118.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_120.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)0>
              ((pybind11 *)&local_40,(str *)&local_110,&local_118,&local_120);
    pybind11::object::~object(&local_40);
    pybind11::object::~object(&local_120);
    pybind11::object::~object(&local_118);
    pybind11::object::~object(&local_110);
    local_f0._0_4_ = 100;
    pybind11::detail::object_api<pybind11::handle>::operator[]
              ((item_accessor *)local_218,(object_api<pybind11::handle> *)&local_228,"x");
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
              ((accessor<pybind11::detail::accessor_policies::generic_item> *)local_218,
               (int *)&local_f0);
    pybind11::object::~object((object *)(auStack_208 + 8));
    pybind11::object::~object((object *)auStack_208);
    pybind11::str::str((str *)&local_128,"y = 200");
    local_130.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_138.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)1>
              ((pybind11 *)&local_48,(str *)&local_128,&local_130,&local_138);
    pybind11::object::~object(&local_48);
    pybind11::object::~object(&local_138);
    pybind11::object::~object(&local_130);
    pybind11::object::~object(&local_128);
    pybind11::str::str((str *)&local_140,"print(\'x + y =\', x + y)");
    local_148.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_150.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)0>
              ((pybind11 *)&local_50,(str *)&local_140,&local_148,&local_150);
    pybind11::object::~object(&local_50);
    pybind11::object::~object(&local_150);
    pybind11::object::~object(&local_148);
    pybind11::object::~object(&local_140);
    pybind11::str::str((str *)&local_158,"z = x + y");
    local_160.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_168.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)1>
              ((pybind11 *)&local_58,(str *)&local_158,&local_160,&local_168);
    pybind11::object::~object(&local_58);
    pybind11::object::~object(&local_168);
    pybind11::object::~object(&local_160);
    pybind11::object::~object(&local_158);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              ((item_accessor *)local_218,(object_api<pybind11::handle> *)&local_228,"z");
    handle = &pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::
              get_cache((accessor<pybind11::detail::accessor_policies::generic_item> *)local_218)->
              super_handle;
    pybind11::detail::load_type<int,void>((type_caster<int,_void> *)&local_f0,handle);
    uVar1 = local_f0._0_4_;
    pybind11::object::~object((object *)(auStack_208 + 8));
    pybind11::object::~object((object *)auStack_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cpp: z = ",9);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pybind11::str::str((str *)&local_170,"def func_01():\n\tprint(\'func_01: call\')\n");
    local_178.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_180.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)2>
              ((pybind11 *)&local_60,(str *)&local_170,&local_178,&local_180);
    pybind11::object::~object(&local_60);
    pybind11::object::~object(&local_180);
    pybind11::object::~object(&local_178);
    pybind11::object::~object(&local_170);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&local_f0,(object_api<pybind11::handle> *)&local_228,"func_01");
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_68);
    pybind11::object::~object(&local_68);
    pybind11::str::str((str *)&local_188,
                       "def func_02(a, b):\n\tprint(\'func_02: {} + {} = {}\'.format(a, b, a + b))\n"
                      );
    local_190.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_198.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)2>
              ((pybind11 *)&local_70,(str *)&local_188,&local_190,&local_198);
    pybind11::object::~object(&local_70);
    pybind11::object::~object(&local_198);
    pybind11::object::~object(&local_190);
    pybind11::object::~object(&local_188);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&local_d0,(object_api<pybind11::handle> *)&local_228,"func_02");
    local_218._0_4_ = 0x7b;
    local_a8._0_4_ = 0x1c8;
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_78,(int *)&local_d0,(int *)local_218);
    pybind11::object::~object(&local_78);
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_80,(char (*) [4])&local_d0,(char (*) [4])"abc");
    pybind11::object::~object(&local_80);
    pybind11::str::str((str *)&local_1a0,"def func_03(a, b):\n\treturn a + b\n");
    local_1a8.m_ptr = local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_1b0.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval<(pybind11::eval_mode)2>
              ((pybind11 *)&local_88,(str *)&local_1a0,(object *)&local_1a8,&local_1b0);
    pybind11::object::~object(&local_88);
    pybind11::object::~object(&local_1b0);
    pybind11::object::~object((object *)&local_1a8);
    pybind11::object::~object(&local_1a0);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&local_a8,(object_api<pybind11::handle> *)&local_228,"func_03");
    local_218._0_4_ = 0x7b;
    local_220.m_ptr._0_4_ = 0x1c8;
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_1e8,(int *)&local_a8,(int *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cpp: func_03 result ",0x14);
    pybind11::str::str((str *)&local_220,&local_1e8);
    pybind11::cast<std::__cxx11::string>
              ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                *)local_218,(pybind11 *)&local_220,object);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((object *)local_218._0_8_ != (object *)auStack_208) {
      operator_delete((void *)local_218._0_8_,(ulong)(auStack_208._0_8_ + 1));
    }
    pybind11::object::~object((object *)&local_220);
    pybind11::object::~object(&local_1e8);
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_1e8,(char (*) [4])&local_a8,(char (*) [4])"abc");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cpp: func_03 result ",0x14);
    pybind11::str::str((str *)&local_220,&local_1e8);
    pybind11::cast<std::__cxx11::string>
              ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                *)local_218,(pybind11 *)&local_220,object_00);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((object *)local_218._0_8_ != (object *)auStack_208) {
      operator_delete((void *)local_218._0_8_,(ulong)(auStack_208._0_8_ + 1));
    }
    pybind11::object::~object((object *)&local_220);
    pybind11::object::~object(&local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n\nAll local variable.\n",0x16);
    local_218._0_8_ = local_228.m_ptr;
    local_218._8_8_ = (PyObject *)0x0;
    auStack_208._0_8_ = (PyObject *)0x0;
    auStack_208._8_8_ = (PyObject *)0x0;
    iVar2 = PyDict_Next(local_228.m_ptr,auStack_208 + 8,local_218 + 8,(PyObject *)auStack_208);
    if (iVar2 == 0) {
      auStack_208._8_8_ = (PyObject *)0xffffffffffffffff;
    }
    local_1d8 = (PyObject *)auStack_208._0_8_;
    local_1d0 = (PyObject *)auStack_208._8_8_;
    local_1e8.super_handle.m_ptr._0_4_ = local_218._0_4_;
    local_1e8.super_handle.m_ptr._4_4_ = local_218._4_4_;
    uStack_1e0 = local_218._8_4_;
    uStack_1dc = local_218._12_4_;
    local_1f0 = lVar3;
    if ((PyObject *)auStack_208._8_8_ != (PyObject *)0xffffffffffffffff) {
      do {
        auVar8 = PyObject_Str(CONCAT44(uStack_1dc,uStack_1e0));
        local_220.m_ptr = auVar8._0_8_;
        pybind11::cast<std::__cxx11::string>
                  ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                    *)local_218,(pybind11 *)&local_220,auVar8._8_8_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
        if ((PyObject *)local_218._0_8_ != (PyObject *)auStack_208) {
          operator_delete((void *)local_218._0_8_,(ulong)(auStack_208._0_8_ + 1));
        }
        pybind11::object::~object((object *)&local_220);
        auVar8 = PyObject_Str(local_1d8);
        local_220.m_ptr = auVar8._0_8_;
        pybind11::cast<std::__cxx11::string>
                  ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                    *)local_218,(pybind11 *)&local_220,auVar8._8_8_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
        if ((PyObject *)local_218._0_8_ != (PyObject *)auStack_208) {
          operator_delete((void *)local_218._0_8_,(ulong)(auStack_208._0_8_ + 1));
        }
        pybind11::object::~object((object *)&local_220);
        auVar8 = PyObject_Str(local_1d8->ob_type);
        local_220.m_ptr = auVar8._0_8_;
        pybind11::cast<std::__cxx11::string>
                  ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                    *)local_218,(pybind11 *)&local_220,auVar8._8_8_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((PyObject *)local_218._0_8_ != (PyObject *)auStack_208) {
          operator_delete((void *)local_218._0_8_,(ulong)(auStack_208._0_8_ + 1));
        }
        pybind11::object::~object((object *)&local_220);
        iVar2 = PyDict_Next(CONCAT44(local_1e8.super_handle.m_ptr._4_4_,
                                     (int)local_1e8.super_handle.m_ptr),&local_1d0,&uStack_1e0,
                            &local_1d8);
      } while ((iVar2 != 0) && (local_1d0 != (PyObject *)0xffffffffffffffff));
    }
    unaff_R13 = local_1f0;
    pybind11::str::str((str *)&local_1b8,"sample01.py");
    local_1c0.super_handle.m_ptr = (handle)(handle)local_1f8.m_ptr;
    if (local_1f8.m_ptr != (PyObject *)0x0) {
      (local_1f8.m_ptr)->ob_refcnt = (local_1f8.m_ptr)->ob_refcnt + 1;
    }
    local_1c8.super_handle.m_ptr = (handle)(handle)local_228.m_ptr;
    if (local_228.m_ptr != (PyObject *)0x0) {
      (local_228.m_ptr)->ob_refcnt = (local_228.m_ptr)->ob_refcnt + 1;
    }
    pybind11::eval_file<(pybind11::eval_mode)2>
              ((pybind11 *)&local_b0,(str *)&local_1b8,&local_1c0,&local_1c8);
    pybind11::object::~object(&local_b0);
    pybind11::object::~object(&local_1c8);
    pybind11::object::~object(&local_1c0);
    pybind11::object::~object(&local_1b8);
    pybind11::object::~object(&local_a8.cache);
    pybind11::object::~object(&local_a8.key);
    pybind11::object::~object((object *)((long)&local_d0 + 0x18));
    pybind11::object::~object((object *)((long)&local_d0 + 0x10));
    pybind11::object::~object((object *)((long)&local_f0 + 0x18));
    pybind11::object::~object((object *)((long)&local_f0 + 0x10));
    pybind11::object::~object((object *)&local_228);
    pybind11::object::~object((object *)&local_1f8);
  }
  Py_Finalize();
  PyMem_RawFree(unaff_R13);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	wchar_t* program = Py_DecodeLocale(argv[0], nullptr);
	if (program == nullptr) {
		fprintf(stderr, "Fatal error: cannot decode argv[0]\n");
		exit(1);
	}
	Py_SetProgramName(program);
	Py_Initialize();

	try {
		auto global = py::dict(py::module::import("__main__").attr("__dict__"));
		auto local = py::dict();

		// http://docs.python.jp/3.5/extending/embedding.html のサンプルを
		// pybind11 で記述
		py::eval<py::eval_single_statement>(
			"from time import time,ctime", global, local);
		py::eval("print('Today is', ctime(time()))", global, local);

		// 変数の定義
		local["x"] = 100;
		py::eval<py::eval_single_statement>("y = 200", global, local);
		py::eval("print('x + y =', x + y)", global, local);

		// 値の取得
		py::eval<py::eval_single_statement>("z = x + y", global, local);
		auto z = local["z"].cast<int>();
		std::cout << "cpp: z = " << z << "\n";

		// 関数定義と呼び出し
		py::eval<py::eval_statements>(
			"def func_01():\n"
			"	print('func_01: call')\n",
			global, local);
		auto func_01 = local["func_01"];
		func_01();

		// 関数へ引数を渡す
		py::eval<py::eval_statements>(
			"def func_02(a, b):\n"
			"	print('func_02: {} + {} = {}'.format(a, b, a + b))\n",
			global, local);
		auto func_02 = local["func_02"];
		func_02(123, 456);
		func_02("abc", "efg");

		// 関数の戻り値を取得する
		py::eval<py::eval_statements>(
			"def func_03(a, b):\n"
			"	return a + b\n",
			global, local);
		auto func_03 = local["func_03"];
		{
			auto result = func_03(123, 456);
			std::cout << "cpp: func_03 result "
					  << py::str(result).cast<std::string>() << "\n";
		}
		{
			auto result = func_03("abc", "def");
			std::cout << "cpp: func_03 result "
					  << py::str(result).cast<std::string>() << "\n";
		}

		std::cout << "\n\nAll local variable.\n";
		for (auto it = local.begin(); it != local.end(); ++it) {
			std::cout << py::str((*it).first).cast<std::string>() << " : ";
			std::cout << py::str((*it).second).cast<std::string>() << " : ";
			std::cout << py::str((*it).second.get_type()).cast<std::string>()
					  << "\n";
		}

		py::eval_file("sample01.py", global, local);
	} catch (py::error_already_set& e) {
		std::cout << "Python error.\n" << e.what() << "\n";
	}

	Py_Finalize();
	PyMem_RawFree(program);

	return 0;
}